

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BamWriter_p.cpp
# Opt level: O0

uint32_t __thiscall
BamTools::Internal::BamWriterPrivate::CalculateMinimumBin(BamWriterPrivate *this,int begin,int end)

{
  int iVar1;
  int end_local;
  int begin_local;
  BamWriterPrivate *this_local;
  undefined4 local_4;
  
  iVar1 = end + -1;
  if (begin >> 0xe == iVar1 >> 0xe) {
    local_4 = (begin >> 0xe) + 0x1249;
  }
  else if (begin >> 0x11 == iVar1 >> 0x11) {
    local_4 = (begin >> 0x11) + 0x249;
  }
  else if (begin >> 0x14 == iVar1 >> 0x14) {
    local_4 = (begin >> 0x14) + 0x49;
  }
  else if (begin >> 0x17 == iVar1 >> 0x17) {
    local_4 = (begin >> 0x17) + 9;
  }
  else if (begin >> 0x1a == iVar1 >> 0x1a) {
    local_4 = (begin >> 0x1a) + 1;
  }
  else {
    local_4 = 0;
  }
  return local_4;
}

Assistant:

uint32_t BamWriterPrivate::CalculateMinimumBin(const int begin, int end) const
{
    --end;
    if ((begin >> 14) == (end >> 14)) {
        return 4681 + (begin >> 14);
    }
    if ((begin >> 17) == (end >> 17)) {
        return 585 + (begin >> 17);
    }
    if ((begin >> 20) == (end >> 20)) {
        return 73 + (begin >> 20);
    }
    if ((begin >> 23) == (end >> 23)) {
        return 9 + (begin >> 23);
    }
    if ((begin >> 26) == (end >> 26)) {
        return 1 + (begin >> 26);
    }
    return 0;
}